

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *
testing::internal::
CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<int,aom_rc_mode,int>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>const,testing::internal::ParamIteratorInterface<std::tuple<int,aom_rc_mode,int>>const>
          (ParamIteratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *base)

{
  bool bVar1;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *pIVar2;
  undefined8 uVar3;
  GTestLog local_c;
  
  if (base != (ParamIteratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)base->_vptr_ParamIteratorInterface[-1],
                       (type_info *)
                       &CartesianProductGenerator<int,aom_rc_mode,int>::
                        IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>::typeinfo);
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x45e);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_c);
    }
    pIVar2 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *)
             __dynamic_cast(base,&ParamIteratorInterface<std::tuple<int,aom_rc_mode,int>>::typeinfo,
                            &CartesianProductGenerator<int,aom_rc_mode,int>::
                             IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>::typeinfo,0
                           );
    return pIVar2;
  }
  uVar3 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar3);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}